

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O0

void msd_CE3(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  size_t sVar3;
  uint16_t uVar4;
  void *__ptr;
  size_t *__ptr_00;
  void *__src;
  ulong local_68;
  size_t i_4;
  size_t bsum;
  size_t i_3;
  size_t i_2;
  uchar **sorted;
  size_t i_1;
  size_t *bucketsize;
  size_t i;
  uint16_t *oracle;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    msd_CE2(strings,n,depth);
  }
  else {
    __ptr = malloc(n << 1);
    for (bucketsize = (size_t *)0x0; bucketsize < n; bucketsize = (size_t *)((long)bucketsize + 1))
    {
      uVar4 = get_char<unsigned_short>(strings[(long)bucketsize],depth);
      *(uint16_t *)((long)__ptr + (long)bucketsize * 2) = uVar4;
    }
    __ptr_00 = (size_t *)calloc(0x10000,8);
    for (sorted = (uchar **)0x0; sorted < n; sorted = (uchar **)((long)sorted + 1)) {
      uVar1 = *(ushort *)((long)__ptr + (long)sorted * 2);
      __ptr_00[uVar1] = __ptr_00[uVar1] + 1;
    }
    __src = malloc(n << 3);
    msd_CE3::bucketindex[0] = 0;
    for (i_3 = 1; i_3 < 0x10000; i_3 = i_3 + 1) {
      msd_CE3::bucketindex[i_3] = msd_CE3::bucketindex[i_3 - 1] + __ptr_00[i_3 - 1];
    }
    for (bsum = 0; bsum < n; bsum = bsum + 1) {
      puVar2 = strings[bsum];
      uVar1 = *(ushort *)((long)__ptr + bsum * 2);
      sVar3 = msd_CE3::bucketindex[uVar1];
      msd_CE3::bucketindex[uVar1] = sVar3 + 1;
      *(uchar **)((long)__src + sVar3 * 8) = puVar2;
    }
    memcpy(strings,__src,n << 3);
    free(__src);
    free(__ptr);
    i_4 = *__ptr_00;
    for (local_68 = 1; local_68 < 0x10000; local_68 = local_68 + 1) {
      if (__ptr_00[local_68] != 0) {
        if ((local_68 & 0xff) != 0) {
          msd_CE3(strings + i_4,__ptr_00[local_68],depth + 2);
        }
        i_4 = __ptr_00[local_68] + i_4;
      }
    }
    free(__ptr_00);
  }
  return;
}

Assistant:

void
msd_CE3(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2(strings, n, depth);
		return;
	}
	uint16_t* restrict oracle =
		(uint16_t*) malloc(n*sizeof(uint16_t));
	for (size_t i=0; i < n; ++i)
		oracle[i] = get_char<uint16_t>(strings[i], depth);
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	unsigned char** sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE3(strings+bsum,
				bucketsize[i], depth+2);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}